

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalMapping::set_allocated_int64tostringmap
          (CategoricalMapping *this,Int64ToStringMap *int64tostringmap)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Int64ToStringMap *int64tostringmap_local;
  CategoricalMapping *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_MappingType(this);
  if (int64tostringmap != (Int64ToStringMap *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&int64tostringmap->super_MessageLite);
    message_arena = (Arena *)int64tostringmap;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::Int64ToStringMap>
                              (message_arena_00,int64tostringmap,submessage_arena_00);
    }
    set_has_int64tostringmap(this);
    (this->MappingType_).stringtoint64map_ = (StringToInt64Map *)message_arena;
  }
  return;
}

Assistant:

void CategoricalMapping::set_allocated_int64tostringmap(::CoreML::Specification::Int64ToStringMap* int64tostringmap) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_MappingType();
  if (int64tostringmap) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(int64tostringmap));
    if (message_arena != submessage_arena) {
      int64tostringmap = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, int64tostringmap, submessage_arena);
    }
    set_has_int64tostringmap();
    MappingType_.int64tostringmap_ = int64tostringmap;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CategoricalMapping.int64ToStringMap)
}